

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::Append4(char *out,AlphaNum *x1,AlphaNum *x2,AlphaNum *x3,AlphaNum *x4)

{
  size_t sVar1;
  char *pcVar2;
  AlphaNum *x4_local;
  AlphaNum *x3_local;
  AlphaNum *x2_local;
  AlphaNum *x1_local;
  char *out_local;
  
  sVar1 = strings::AlphaNum::size(x1);
  x1_local = (AlphaNum *)out;
  if (sVar1 != 0) {
    pcVar2 = strings::AlphaNum::data(x1);
    sVar1 = strings::AlphaNum::size(x1);
    memcpy(out,pcVar2,sVar1);
    sVar1 = strings::AlphaNum::size(x1);
    x1_local = (AlphaNum *)(out + sVar1);
  }
  sVar1 = strings::AlphaNum::size(x2);
  if (sVar1 != 0) {
    pcVar2 = strings::AlphaNum::data(x2);
    sVar1 = strings::AlphaNum::size(x2);
    memcpy(x1_local,pcVar2,sVar1);
    sVar1 = strings::AlphaNum::size(x2);
    x1_local = (AlphaNum *)(x1_local->digits + (sVar1 - 0x10));
  }
  sVar1 = strings::AlphaNum::size(x3);
  if (sVar1 != 0) {
    pcVar2 = strings::AlphaNum::data(x3);
    sVar1 = strings::AlphaNum::size(x3);
    memcpy(x1_local,pcVar2,sVar1);
    sVar1 = strings::AlphaNum::size(x3);
    x1_local = (AlphaNum *)(x1_local->digits + (sVar1 - 0x10));
  }
  sVar1 = strings::AlphaNum::size(x4);
  if (sVar1 != 0) {
    pcVar2 = strings::AlphaNum::data(x4);
    sVar1 = strings::AlphaNum::size(x4);
    memcpy(x1_local,pcVar2,sVar1);
    sVar1 = strings::AlphaNum::size(x4);
    x1_local = (AlphaNum *)(x1_local->digits + (sVar1 - 0x10));
  }
  return (char *)x1_local;
}

Assistant:

static char *Append4(char *out, const AlphaNum &x1, const AlphaNum &x2,
                     const AlphaNum &x3, const AlphaNum &x4) {
  if (x1.size() > 0) {
    memcpy(out, x1.data(), x1.size());
    out += x1.size();
  }
  if (x2.size() > 0) {
    memcpy(out, x2.data(), x2.size());
    out += x2.size();
  }
  if (x3.size() > 0) {
    memcpy(out, x3.data(), x3.size());
    out += x3.size();
  }
  if (x4.size() > 0) {
    memcpy(out, x4.data(), x4.size());
    out += x4.size();
  }
  return out;
}